

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

ctmbstr tidyOptGetNextMutedMessage(TidyDoc tdoc,TidyIterator *iter)

{
  int iVar1;
  char *pcVar2;
  TidyIterator p_Var3;
  TidyDocImpl *impl;
  TidyIterator p_Var4;
  uint uVar5;
  ulong uVar6;
  
  if (tdoc == (TidyDoc)0x0) {
    if (iter != (TidyIterator *)0x0) {
      *iter = (TidyIterator)0x0;
    }
    return (ctmbstr)0x0;
  }
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                  ,0x563,"ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *, TidyIterator *)");
  }
  p_Var3 = *iter;
  if (p_Var3 == (TidyIterator)0x0) {
    p_Var3 = (TidyIterator)0x0;
  }
  else if (p_Var3 <= (TidyIterator)(ulong)(uint)tdoc[0xce4]._opaque) {
    iVar1 = *(int *)(*(long *)(tdoc + 0xce2) + -4 + (long)p_Var3 * 4);
    if (iVar1 == 0x12d) {
      pcVar2 = "TidyDiagnostics";
    }
    else {
      uVar5 = 1;
      do {
        pcVar2 = tidyStringsKeys[uVar5].key;
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "UNDEFINED";
          break;
        }
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (tidyStringsKeys[uVar6].value != iVar1);
    }
    p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
    goto LAB_001519b6;
  }
  pcVar2 = (ctmbstr)0x0;
LAB_001519b6:
  p_Var4 = (TidyIterator)0x0;
  if (p_Var3 <= (TidyIterator)(ulong)(uint)tdoc[0xce4]._opaque) {
    p_Var4 = p_Var3;
  }
  *iter = p_Var4;
  return pcVar2;
}

Assistant:

ctmbstr TIDY_CALL      tidyOptGetNextMutedMessage(TidyDoc tdoc, TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr result = NULL;
    if ( impl )
        result = TY_(getNextMutedMessage)( impl, iter );
    else if ( iter )
        *iter = 0;
    return result;
}